

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DiffuseAreaLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  short sVar9;
  Normal3f n;
  Sphere *this_00;
  Curve *this_01;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar20 [48];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar32 [56];
  float fVar33;
  float fVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  Point3f p;
  Vector3f w;
  SampledSpectrum SVar46;
  optional<pbrt::ShapeSample> ss;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Tuple3<pbrt::Vector3,_float> local_1a8;
  undefined1 local_198 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_180;
  char local_128;
  SampledSpectrum local_120;
  anon_struct_8_0_00000001_for___align local_110;
  float afStack_108 [2];
  Tuple3<pbrt::Point3,_float> local_100;
  float fStack_f4;
  float fStack_f0;
  undefined8 uStack_ec;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_e0;
  aligned_storage_t<sizeof(pbrt::Interaction),_alignof(pbrt::Interaction)> local_d8;
  bool local_88;
  undefined8 local_80;
  RayDifferential local_78;
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar29 [56];
  undefined1 auVar31 [64];
  
  auVar20 = in_ZmmResult._16_48_;
  uVar1 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  sVar9 = (short)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      Sphere::Sample((optional<pbrt::ShapeSample> *)&local_180.__align,this_00,u1);
    }
    else if (sVar9 == 2) {
      Cylinder::Sample((optional<pbrt::ShapeSample> *)&local_180.__align,(Cylinder *)this_00,u1);
    }
    else {
      Disk::Sample((optional<pbrt::ShapeSample> *)&local_180.__align,(Disk *)this_00,u1);
    }
  }
  else {
    this_01 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x30 == 5) {
      BilinearPatch::Sample
                ((optional<pbrt::ShapeSample> *)&local_180.__align,(BilinearPatch *)this_01,u1);
    }
    else if (sVar9 == 4) {
      Triangle::Sample((optional<pbrt::ShapeSample> *)&local_180.__align,(Triangle *)this_01,u1);
    }
    else {
      Curve::Sample((optional<pbrt::ShapeSample> *)&local_180.__align,this_01,u1);
    }
  }
  if (local_128 == '\0') goto LAB_00358799;
  local_180._64_8_ = &(this->super_LightBase).mediumInterface;
  local_1a8.x = 0.0;
  local_1a8.y = 0.0;
  local_1a8.z = 0.0;
  local_1b8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_1b4 = u2.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_1b0 = (float)in_XMM1_Qb;
  fStack_1ac = (float)((ulong)in_XMM1_Qb >> 0x20);
  local_180._24_4_ = time;
  if (this->twoSided == true) {
    if (0.5 <= local_1b8) {
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(local_1b8 + -0.5 + local_1b8 + -0.5)));
      auVar24._0_4_ = auVar13._0_4_ + auVar13._0_4_;
      auVar24._4_4_ = fStack_1b4 + fStack_1b4;
      auVar24._8_4_ = fStack_1b0 + fStack_1b0;
      auVar24._12_4_ = fStack_1ac + fStack_1ac;
      auVar5._8_4_ = 0xbf800000;
      auVar5._0_8_ = 0xbf800000bf800000;
      auVar5._12_4_ = 0xbf800000;
      auVar11 = vaddps_avx512vl(auVar24,auVar5);
      auVar13 = vmovshdup_avx(auVar11);
      fVar21 = auVar11._0_4_;
      fVar10 = auVar13._0_4_;
      if (fVar21 == 0.0) {
        auVar13 = ZEXT816(0);
        if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_00358663;
      }
      else {
LAB_00358663:
        auVar6._8_4_ = 0x7fffffff;
        auVar6._0_8_ = 0x7fffffff7fffffff;
        auVar6._12_4_ = 0x7fffffff;
        auVar12 = vandps_avx512vl(auVar11,auVar6);
        auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
        bVar8 = auVar13._0_4_ < auVar12._0_4_;
        auVar36._0_4_ = fVar21 / fVar10;
        auVar36._4_12_ = auVar11._4_12_;
        auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar36,ZEXT416(0x3fc90fdb));
        auVar19._16_48_ = auVar20;
        auVar19._0_16_ = auVar13;
        auVar18._4_60_ = auVar19._4_60_;
        auVar18._0_4_ =
             (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) +
                    (uint)!bVar8 * auVar13._0_4_);
        local_198 = auVar18._0_16_;
        fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
        fVar21 = cosf(auVar18._0_4_);
        fVar22 = sinf((float)local_198._0_4_);
        auVar13 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),
                                0x10);
      }
      auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
      auVar11 = vmovshdup_avx(auVar13);
      auVar11 = vfnmadd213ss_fma(auVar11,auVar11,auVar12);
      auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
      if (auVar11._0_4_ < 0.0) {
        auVar27._0_4_ = sqrtf(auVar11._0_4_);
        auVar27._4_60_ = extraout_var_00;
        auVar11 = auVar27._0_16_;
      }
      else {
        auVar11 = vsqrtss_avx(auVar11,auVar11);
      }
      local_1a8._0_8_ = vmovlps_avx(auVar13);
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(auVar11,auVar7);
    }
    else {
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(local_1b8 + local_1b8)));
      auVar23._0_4_ = auVar13._0_4_ + auVar13._0_4_;
      auVar23._4_4_ = fStack_1b4 + fStack_1b4;
      auVar23._8_4_ = fStack_1b0 + fStack_1b0;
      auVar23._12_4_ = fStack_1ac + fStack_1ac;
      auVar2._8_4_ = 0xbf800000;
      auVar2._0_8_ = 0xbf800000bf800000;
      auVar2._12_4_ = 0xbf800000;
      auVar11 = vaddps_avx512vl(auVar23,auVar2);
      auVar13 = vmovshdup_avx(auVar11);
      fVar21 = auVar11._0_4_;
      fVar10 = auVar13._0_4_;
      if (fVar21 == 0.0) {
        auVar12 = ZEXT816(0);
        if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_0035848d;
      }
      else {
LAB_0035848d:
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar12 = vandps_avx512vl(auVar11,auVar3);
        auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
        bVar8 = auVar13._0_4_ < auVar12._0_4_;
        auVar34._0_4_ = fVar21 / fVar10;
        auVar34._4_12_ = auVar11._4_12_;
        auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar34,ZEXT416(0x3fc90fdb));
        auVar15._16_48_ = auVar20;
        auVar15._0_16_ = auVar13;
        auVar14._4_60_ = auVar15._4_60_;
        auVar14._0_4_ =
             (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) +
                    (uint)!bVar8 * auVar13._0_4_);
        local_198 = auVar14._0_16_;
        fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
        fVar21 = cosf(auVar14._0_4_);
        fVar22 = sinf((float)local_198._0_4_);
        auVar12 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),
                                0x10);
      }
      auVar11 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar12,auVar12);
      auVar13 = vmovshdup_avx(auVar12);
      auVar13 = vfnmadd213ss_fma(auVar13,auVar13,auVar11);
      auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
      if (auVar13._0_4_ < 0.0) {
        auVar26._0_4_ = sqrtf(auVar13._0_4_);
        auVar26._4_60_ = extraout_var;
        auVar13 = auVar26._0_16_;
      }
      else {
        auVar13 = vsqrtss_avx(auVar13,auVar13);
      }
      local_1a8._0_8_ = vmovlps_avx(auVar12);
    }
    local_1a8.z = auVar13._0_4_;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar13,auVar4);
    fVar10 = auVar13._0_4_ * 0.31830987 * 0.5;
  }
  else {
    auVar11._0_4_ = local_1b8 + local_1b8;
    auVar11._4_4_ = fStack_1b4 + fStack_1b4;
    auVar11._8_4_ = fStack_1b0 + fStack_1b0;
    auVar11._12_4_ = fStack_1ac + fStack_1ac;
    auVar13._8_4_ = 0xbf800000;
    auVar13._0_8_ = 0xbf800000bf800000;
    auVar13._12_4_ = 0xbf800000;
    auVar11 = vaddps_avx512vl(auVar11,auVar13);
    auVar13 = vmovshdup_avx(auVar11);
    fVar21 = auVar11._0_4_;
    fVar10 = auVar13._0_4_;
    if (fVar21 == 0.0) {
      auVar13 = ZEXT816(0);
      if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_0035856d;
    }
    else {
LAB_0035856d:
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar12 = vandps_avx512vl(auVar11,auVar12);
      auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
      bVar8 = auVar13._0_4_ < auVar12._0_4_;
      auVar35._0_4_ = fVar21 / fVar10;
      auVar35._4_12_ = auVar11._4_12_;
      auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar35,ZEXT416(0x3fc90fdb));
      auVar17._16_48_ = auVar20;
      auVar17._0_16_ = auVar13;
      auVar16._4_60_ = auVar17._4_60_;
      auVar16._0_4_ =
           (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) + (uint)!bVar8 * auVar13._0_4_
                  );
      local_198 = auVar16._0_16_;
      fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
      fVar21 = cosf(auVar16._0_4_);
      fVar22 = sinf((float)local_198._0_4_);
      auVar13 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),0x10
                             );
    }
    auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
    auVar11 = vmovshdup_avx(auVar13);
    auVar11 = vfnmadd213ss_fma(auVar11,auVar11,auVar12);
    auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
    if (auVar11._0_4_ < 0.0) {
      local_1a8.z = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      local_1a8.z = auVar11._0_4_;
    }
    local_1a8._0_8_ = vmovlps_avx(auVar13);
    fVar10 = local_1a8.z * 0.31830987;
  }
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    if (local_128 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
    }
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_180._40_8_;
    n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_180._48_4_;
    n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_180._40_4_;
    n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_180._44_4_;
    auVar25._8_4_ = 0x80000000;
    auVar25._0_8_ = 0x8000000080000000;
    auVar25._12_4_ = 0x80000000;
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar12 = vpternlogd_avx512vl(auVar30,ZEXT416((uint)local_180._48_4_),auVar25,0xf8);
    fVar40 = auVar12._0_4_;
    auVar39._0_4_ = -1.0 / ((float)local_180._48_4_ + fVar40);
    auVar13 = vmovshdup_avx(auVar37);
    fVar33 = (float)local_180._40_8_;
    auVar43._8_8_ = 0;
    auVar43._0_4_ = local_1a8.x;
    auVar43._4_4_ = local_1a8.y;
    fVar42 = local_1a8.x;
    auVar41._0_4_ = fVar33 * fVar42;
    fVar38 = (float)((ulong)local_180._40_8_ >> 0x20);
    auVar41._4_4_ = fVar38 * local_1a8.y;
    auVar41._8_8_ = 0;
    auVar11 = vmovshdup_avx(auVar41);
    fVar21 = local_1a8.z * (float)local_180._48_4_ + (fVar42 * fVar33 * -fVar40 - auVar11._0_4_);
    fVar22 = fVar33 * auVar13._0_4_ * auVar39._0_4_;
    auVar44._0_4_ = fVar33 * fVar40 * fVar33;
    auVar44._4_4_ = fVar38 * 0.0;
    auVar44._8_8_ = 0;
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    auVar45._8_4_ = 0x3f800000;
    auVar45._0_8_ = 0x3f8000003f800000;
    auVar45._12_4_ = 0x3f800000;
    auVar13 = vunpcklps_avx(auVar45,auVar12);
    auVar11 = vfmadd231ps_fma(auVar13,auVar44,auVar39);
    auVar12 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar40 * fVar22)),
                                 ZEXT416((uint)fVar22));
    auVar13 = vshufps_avx(auVar43,auVar43,0xe1);
    fVar22 = local_1a8.z * fVar33 + fVar42 * auVar11._0_4_ + auVar13._0_4_ * auVar12._0_4_;
    fVar40 = local_1a8.z * fVar38 + local_1a8.y * auVar11._4_4_ + auVar13._4_4_ * auVar12._4_4_;
    local_1a8._0_8_ =
         vmovlps_avx(CONCAT412(local_1a8.z * 0.0 +
                               auVar11._12_4_ * 0.0 + auVar13._12_4_ * auVar12._12_4_,
                               CONCAT48(local_1a8.z * 0.0 +
                                        auVar11._8_4_ * 0.0 + auVar13._8_4_ * auVar12._8_4_,
                                        CONCAT44(fVar40,fVar22))));
    auVar13 = vinsertps_avx(ZEXT416((uint)(((float)local_180._0_4_ + (float)local_180._4_4_) * 0.5))
                            ,ZEXT416((uint)(((float)local_180._8_4_ + (float)local_180._12_4_) * 0.5
                                           )),0x10);
    p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar13._0_8_;
    p.super_Tuple3<pbrt::Point3,_float>.z =
         ((float)local_180._16_4_ + (float)local_180._20_4_) * 0.5;
    auVar32 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
    auVar29 = ZEXT856(auVar13._8_8_);
    w.super_Tuple3<pbrt::Vector3,_float>.z = fVar21;
    w.super_Tuple3<pbrt::Vector3,_float>.x = fVar22;
    w.super_Tuple3<pbrt::Vector3,_float>.y = fVar40;
    local_1a8.z = fVar21;
    SVar46 = L(this,p,n,(Point2f)local_180._52_8_,w,lambda);
    auVar31._0_8_ = SVar46.values.values._8_8_;
    auVar31._8_56_ = auVar32;
    auVar28._0_8_ = SVar46.values.values._0_8_;
    auVar28._8_56_ = auVar29;
    local_120.values.values = (array<float,_4>)vmovlhps_avx(auVar28._0_16_,auVar31._0_16_);
    Interaction::SpawnRay(&local_78,(Interaction *)&local_180.__align,(Vector3f *)&local_1a8);
    if (local_128 != '\0') {
      LightLeSample::LightLeSample
                ((LightLeSample *)&local_110,&local_120,&local_78.super_Ray,
                 (Interaction *)&local_180.__align,(Float)local_180._80_4_,fVar10);
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align = local_110;
      *(float (*) [2])((long)&__return_storage_ptr__->optionalValue + 8) = afStack_108;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_100._0_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           CONCAT44(fStack_f4,local_100.z);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           CONCAT44(fStack_f0,fStack_f4);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = uStack_ec;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        *)((long)&__return_storage_ptr__->optionalValue + 0x30))->bits = local_e0.bits;
      (__return_storage_ptr__->optionalValue).__data[0x88] = local_88;
      if (local_88 == true) {
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_d8._64_8_;
        *(anon_struct_8_0_00000001_for___align *)
         ((long)&__return_storage_ptr__->optionalValue + 0x38) = local_d8.__align;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_d8._8_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_d8._16_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_d8._24_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_d8._32_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_d8._40_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_d8._48_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_d8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_d8._72_8_;
      }
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_80;
      return __return_storage_ptr__;
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
  }
LAB_00358799:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DiffuseAreaLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample a point on the area light's _Shape_
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    Float pdfDir;
    if (twoSided) {
        // Choose side of surface and sample cosine-weighted outgoing direction
        if (u2[0] < 0.5f) {
            u2[0] = std::min(u2[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
        } else {
            u2[0] = std::min((u2[0] - 0.5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));

    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }
    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    const Interaction &intr = ss->intr;
    Frame nFrame = Frame::FromZ(intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(intr.p(), intr.n, intr.uv, w, lambda), intr.SpawnRay(w), intr,
                         ss->pdf, pdfDir);
}